

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O2

void __thiscall net_uv::UVLoop::free_buf(UVLoop *this,uv_buf_t *buf)

{
  if (buf == (uv_buf_t *)0x0) {
    return;
  }
  if (10 < (this->m_freeReadBufList).super__List_base<uv_buf_t,_std::allocator<uv_buf_t>_>._M_impl.
           _M_node._M_size) {
    free(buf->base);
    return;
  }
  std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::push_back(&this->m_freeReadBufList,buf);
  return;
}

Assistant:

void UVLoop::free_buf(const uv_buf_t* buf)
{
	if (buf == NULL)
	{
		return;
	}

	if (m_freeReadBufList.size() > 10)
	{
		fc_free(buf->base);
		return;
	}

	m_freeReadBufList.push_back(*buf);
}